

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringtokenizer.h
# Opt level: O0

void __thiscall QStringTokenizerBase<QStringView,_QChar>::iterator::advance(iterator *this)

{
  long lVar1;
  QStringTokenizerBase<QStringView,_QChar> *in_RDI;
  long in_FS_OFFSET;
  tokenizer_state in_stack_00000000;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  undefined4 uStack_24;
  Int IStack_20;
  CaseSensitivity CStack_1c;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QStringTokenizerBase<QStringView,_QChar>::next(in_RDI,in_stack_00000000);
  *(undefined4 *)&in_RDI[1].m_haystack.m_size = local_18;
  *(undefined4 *)((long)&in_RDI[1].m_haystack.m_size + 4) = uStack_14;
  *(undefined4 *)&in_RDI[1].m_haystack.m_data = uStack_10;
  *(undefined4 *)((long)&in_RDI[1].m_haystack.m_data + 4) = uStack_c;
  *(undefined4 *)&in_RDI->m_needle = local_28;
  *(undefined4 *)&in_RDI->field_0x1c = uStack_24;
  in_RDI[1].super_QStringTokenizerBaseBase.m_sb.super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>
  .super_QFlagsStorage<Qt::SplitBehaviorFlags>.i = IStack_20;
  in_RDI[1].super_QStringTokenizerBaseBase.m_cs = CStack_1c;
  *(undefined4 *)&(in_RDI->m_haystack).m_size = local_38;
  *(undefined4 *)((long)&(in_RDI->m_haystack).m_size + 4) = uStack_34;
  *(undefined4 *)&(in_RDI->m_haystack).m_data = uStack_30;
  *(undefined4 *)((long)&(in_RDI->m_haystack).m_data + 4) = uStack_2c;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void advance() {
            Q_ASSERT(current.ok);
            current = tokenizer->next(current.state);
        }